

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repack_script_text_translation.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *path;
  char *path_00;
  char *path_01;
  bool bVar1;
  int iVar2;
  undefined1 local_160 [8];
  Mzp mzp;
  Mzp translated_mzp;
  _Any_data local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_90 [8];
  string script_text_raw;
  string translation_db_raw;
  string mzp_out;
  json translation_db;
  
  if (argc == 4) {
    path = argv[1];
    path_00 = argv[2];
    path_01 = argv[3];
    local_90 = (undefined1  [8])&script_text_raw._M_string_length;
    script_text_raw._M_dataplus._M_p = (pointer)0x0;
    script_text_raw._M_string_length._0_1_ = 0;
    bVar1 = mg::fs::read_file(path_00,(string *)local_90);
    if (bVar1) {
      mzp.entry_data.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      mzp.entry_data.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      mzp.entry_headers.
      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      mzp.entry_headers.
      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      mzp.header.magic[0] = '\0';
      mzp.header.magic[1] = '\0';
      mzp.header.magic[2] = '\0';
      mzp.header.magic[3] = '\0';
      mzp.header.magic[4] = '\0';
      mzp.header.magic[5] = '\0';
      mzp.header.archive_entry_count = 0;
      mzp.entry_headers.
      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bVar1 = mg::data::mzp_read((string *)local_90,(Mzp *)local_160);
      if (bVar1) {
        script_text_raw.field_2._8_8_ = &translation_db_raw._M_string_length;
        translation_db_raw._M_dataplus._M_p = (pointer)0x0;
        translation_db_raw._M_string_length._0_1_ = 0;
        bVar1 = mg::fs::read_file(path,(string *)((long)&script_text_raw.field_2 + 8));
        if (bVar1) {
          local_b8._M_unused._M_object = (void *)0x0;
          local_b8._8_8_ = 0;
          local_a8 = 0;
          uStack_a0 = 0;
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::parse<std::__cxx11::string&>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)(mzp_out.field_2._M_local_buf + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&script_text_raw.field_2 + 8),(parser_callback_t *)&local_b8,true,false)
          ;
          std::_Function_base::~_Function_base((_Function_base *)&local_b8);
          mg::data::Mzp::Mzp((Mzp *)&translated_mzp.entry_data.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (Mzp *)local_160);
          patch_string_table((Mzp *)&mzp.entry_data.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (json *)((long)&mzp_out.field_2 + 8),
                             (Mzp *)&translated_mzp.entry_data.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          mg::data::Mzp::~Mzp((Mzp *)&translated_mzp.entry_data.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          translation_db_raw.field_2._8_8_ = &mzp_out._M_string_length;
          mzp_out._M_dataplus._M_p = (pointer)0x0;
          mzp_out._M_string_length._0_1_ = 0;
          mg::data::mzp_write((Mzp *)&mzp.entry_data.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (string *)((long)&translation_db_raw.field_2 + 8));
          bVar1 = mg::fs::write_file(path_01,(string *)((long)&translation_db_raw.field_2 + 8));
          iVar2 = bVar1 - 1;
          std::__cxx11::string::~string((string *)(translation_db_raw.field_2._M_local_buf + 8));
          mg::data::Mzp::~Mzp((Mzp *)&mzp.entry_data.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)((long)&mzp_out.field_2 + 8));
        }
        else {
          fprintf(_stderr,"Failed to translation db from \'%s\'\n",path);
          iVar2 = -1;
        }
        std::__cxx11::string::~string((string *)(script_text_raw.field_2._M_local_buf + 8));
      }
      else {
        fwrite("Failed to parse script data as MZP\n",0x23,1,_stderr);
        iVar2 = -1;
      }
      mg::data::Mzp::~Mzp((Mzp *)local_160);
    }
    else {
      fprintf(_stderr,"Failed to read script text from \'%s\'\n",path_00);
      iVar2 = -1;
    }
    std::__cxx11::string::~string((string *)local_90);
  }
  else {
    fprintf(_stderr,"%s translation_db.json script_in.mrg script_out.mrg\n",*argv);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 4) {
    fprintf(stderr, "%s translation_db.json script_in.mrg script_out.mrg\n",
            argv[0]);
    return -1;
  }

  // Name args
  const char *translation_db_filename = argv[1];
  const char *input_mrg = argv[2];
  const char *output_mrg = argv[3];

  // Try and load input script text
  std::string script_text_raw;
  if (!mg::fs::read_file(input_mrg, script_text_raw)) {
    fprintf(stderr, "Failed to read script text from '%s'\n", input_mrg);
    return -1;
  }

  // Attempt to parse script text as MZP archive
  mg::data::Mzp mzp;
  if (!mg::data::mzp_read(script_text_raw, mzp)) {
    fprintf(stderr, "Failed to parse script data as MZP\n");
    return -1;
  }

  // Try and load the translation DB
  std::string translation_db_raw;
  if (!mg::fs::read_file(translation_db_filename, translation_db_raw)) {
    fprintf(stderr, "Failed to translation db from '%s'\n",
            translation_db_filename);
    return -1;
  }
  nlohmann::json translation_db = nlohmann::json::parse(translation_db_raw);

  // Retranslate the script
  mg::data::Mzp translated_mzp = patch_string_table(translation_db, mzp);

  // Write out the translated archive
  std::string mzp_out;
  mg::data::mzp_write(translated_mzp, mzp_out);
  if (!mg::fs::write_file(output_mrg, mzp_out)) {
    return -1;
  }

  return 0;
}